

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::VertexIsHidden(ON_Mesh *this,int meshvi)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  byte local_25;
  int vcount;
  int meshvi_local;
  ON_Mesh *this_local;
  
  iVar1 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (((0 < this->m_hidden_count) && (-1 < meshvi)) && (meshvi < iVar1)) {
    iVar2 = ON_SimpleArray<bool>::Count(&this->m_H);
    if (iVar1 == iVar2) {
      pbVar3 = ON_SimpleArray<bool>::operator[](&this->m_H,meshvi);
      local_25 = *pbVar3;
      goto LAB_00728660;
    }
  }
  local_25 = 0;
LAB_00728660:
  return (bool)(local_25 & 1);
}

Assistant:

bool ON_Mesh::VertexIsHidden(int meshvi) const
{
  const int vcount = m_V.Count();
  return ((m_hidden_count > 0 && meshvi >= 0 && meshvi < vcount && vcount == m_H.Count()) 
          ? m_H[meshvi]
          : false);
}